

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestsetStringWithHeaderGroup::RunImpl(TestsetStringWithHeaderGroup *this)

{
  TestResults *results;
  char *__s;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_571;
  string local_570 [32];
  DataDictionary local_550 [8];
  DataDictionary dataDictionary;
  Message local_168 [8];
  Message object;
  TestsetStringWithHeaderGroup *this_local;
  
  FIX::Message::Message(local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_570,"../spec/FIX43.xml",&local_571);
  FIX::DataDictionary::DataDictionary(local_550,local_570,false);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  __s = RunImpl::str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,__s,&local_5a9);
  FIX::Message::setString(local_168,&local_5a8,true,local_550);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  FIX::Message::toString_abi_cxx11_((int)&local_5d0,(int)local_168,8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_5f0,*ppTVar2,0xf1);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>
            (results,&RunImpl::str,&local_5d0,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  FIX::DataDictionary::~DataDictionary(local_550);
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

TEST(setStringWithHeaderGroup)
{
  FIX::Message object;
  DataDictionary dataDictionary( "../spec/FIX43.xml" );
  static const char* str =
    "8=FIX.4.3\0019=152\00135=A\00134=125\00149=BUYSIDE\001"
    "52=20040916-16:19:18.328\00156=SELLSIDE\001"
    "627=2\001628=HOP1\001629=20040916-16:19:18.328\001630=ID1\001"
    "628=HOP2\001629=20040916-16:19:18.328\001630=ID2\001"
    "10=079\001";

  object.setString( str, true, &dataDictionary );
  CHECK_EQUAL( str, object.toString() );
}